

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlTextReaderLocatorPtrWrap(xmlTextReaderLocatorPtr locator)

{
  PyObject *ret;
  xmlTextReaderLocatorPtr locator_local;
  
  if (locator == (xmlTextReaderLocatorPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    locator_local = &_Py_NoneStruct;
  }
  else {
    locator_local = (xmlTextReaderLocatorPtr)PyCapsule_New(locator,"xmlTextReaderLocatorPtr",0);
  }
  return (PyObject *)locator_local;
}

Assistant:

PyObject *
libxml_xmlTextReaderLocatorPtrWrap(xmlTextReaderLocatorPtr locator)
{
    PyObject *ret;

    if (locator == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) locator,
                                     (char *) "xmlTextReaderLocatorPtr", NULL);
    return (ret);
}